

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O1

string * __thiscall
test_get_rows_back::vars_abi_cxx11_(string *__return_storage_ptr__,test_get_rows_back *this)

{
  size_type *psVar1;
  bool bVar2;
  undefined8 uVar3;
  char *__s;
  long *plVar4;
  undefined8 *puVar5;
  long *plVar6;
  ulong *puVar7;
  ulong uVar8;
  string __str;
  ulong *local_2d0;
  long local_2c8;
  ulong local_2c0;
  long lStack_2b8;
  ulong *local_2b0;
  long local_2a8;
  ulong local_2a0;
  long lStack_298;
  ulong *local_290;
  long local_288;
  ulong local_280;
  long lStack_278;
  ulong *local_270;
  long local_268;
  ulong local_260;
  long lStack_258;
  ulong *local_250;
  long local_248;
  ulong local_240;
  long lStack_238;
  ulong *local_230;
  long local_228;
  ulong local_220;
  long lStack_218;
  ulong *local_210;
  long local_208;
  ulong local_200;
  long lStack_1f8;
  ulong *local_1f0;
  long local_1e8;
  ulong local_1e0;
  long lStack_1d8;
  long *local_1d0;
  undefined8 local_1c8;
  long local_1c0;
  undefined8 uStack_1b8;
  long *local_1b0;
  undefined8 local_1a8;
  long local_1a0;
  undefined8 uStack_198;
  long *local_190;
  undefined8 local_188;
  long local_180;
  undefined8 uStack_178;
  long *local_170;
  undefined8 local_168;
  long local_160;
  undefined8 uStack_158;
  ulong *local_150;
  long local_148;
  ulong local_140;
  long lStack_138;
  ulong *local_130;
  long local_128;
  ulong local_120;
  long lStack_118;
  long *local_110;
  long local_108;
  long local_100;
  long lStack_f8;
  long *local_f0 [2];
  long local_e0 [2];
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  long *local_50 [2];
  long local_40 [2];
  
  __s = (char *)ggml_type_name(this->type);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_50,__s,(allocator<char> *)&local_2d0);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x158f46);
  local_110 = &local_100;
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_100 = *plVar6;
    lStack_f8 = plVar4[3];
  }
  else {
    local_100 = *plVar6;
    local_110 = (long *)*plVar4;
  }
  local_108 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_110);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_240 = *puVar7;
    lStack_238 = plVar4[3];
    local_250 = &local_240;
  }
  else {
    local_240 = *puVar7;
    local_250 = (ulong *)*plVar4;
  }
  local_248 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  var_to_str<int>(&local_70,&this->n);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x159228);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_2c0 = *puVar7;
    lStack_2b8 = plVar4[3];
    local_2d0 = &local_2c0;
  }
  else {
    local_2c0 = *puVar7;
    local_2d0 = (ulong *)*plVar4;
  }
  local_2c8 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  uVar8 = 0xf;
  if (local_250 != &local_240) {
    uVar8 = local_240;
  }
  if (uVar8 < (ulong)(local_2c8 + local_248)) {
    uVar8 = 0xf;
    if (local_2d0 != &local_2c0) {
      uVar8 = local_2c0;
    }
    if (uVar8 < (ulong)(local_2c8 + local_248)) goto LAB_00120163;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_2d0,0,(char *)0x0,(ulong)local_250);
  }
  else {
LAB_00120163:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_250,(ulong)local_2d0);
  }
  local_1d0 = &local_1c0;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_1c0 = *plVar4;
    uStack_1b8 = puVar5[3];
  }
  else {
    local_1c0 = *plVar4;
    local_1d0 = (long *)*puVar5;
  }
  local_1c8 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_1d0);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_220 = *puVar7;
    lStack_218 = plVar4[3];
    local_230 = &local_220;
  }
  else {
    local_220 = *puVar7;
    local_230 = (ulong *)*plVar4;
  }
  local_228 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  var_to_str<int>(&local_90,&this->m);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,0x1590bd);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_260 = *puVar7;
    lStack_258 = plVar4[3];
    local_270 = &local_260;
  }
  else {
    local_260 = *puVar7;
    local_270 = (ulong *)*plVar4;
  }
  local_268 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  uVar8 = 0xf;
  if (local_230 != &local_220) {
    uVar8 = local_220;
  }
  if (uVar8 < (ulong)(local_268 + local_228)) {
    uVar8 = 0xf;
    if (local_270 != &local_260) {
      uVar8 = local_260;
    }
    if (uVar8 < (ulong)(local_268 + local_228)) goto LAB_001202f8;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_270,0,(char *)0x0,(ulong)local_230);
  }
  else {
LAB_001202f8:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_230,(ulong)local_270);
  }
  local_1b0 = &local_1a0;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_1a0 = *plVar4;
    uStack_198 = puVar5[3];
  }
  else {
    local_1a0 = *plVar4;
    local_1b0 = (long *)*puVar5;
  }
  local_1a8 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_1b0);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_200 = *puVar7;
    lStack_1f8 = plVar4[3];
    local_210 = &local_200;
  }
  else {
    local_200 = *puVar7;
    local_210 = (ulong *)*plVar4;
  }
  local_208 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  var_to_str<int>(&local_b0,&this->r);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,0x1592b3);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_280 = *puVar7;
    lStack_278 = plVar4[3];
    local_290 = &local_280;
  }
  else {
    local_280 = *puVar7;
    local_290 = (ulong *)*plVar4;
  }
  local_288 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  uVar8 = 0xf;
  if (local_210 != &local_200) {
    uVar8 = local_200;
  }
  if (uVar8 < (ulong)(local_288 + local_208)) {
    uVar8 = 0xf;
    if (local_290 != &local_280) {
      uVar8 = local_280;
    }
    if (uVar8 < (ulong)(local_288 + local_208)) goto LAB_0012048d;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_290,0,(char *)0x0,(ulong)local_210);
  }
  else {
LAB_0012048d:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_210,(ulong)local_290);
  }
  local_190 = &local_180;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_180 = *plVar4;
    uStack_178 = puVar5[3];
  }
  else {
    local_180 = *plVar4;
    local_190 = (long *)*puVar5;
  }
  local_188 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_190);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_140 = *puVar7;
    lStack_138 = plVar4[3];
    local_150 = &local_140;
  }
  else {
    local_140 = *puVar7;
    local_150 = (ulong *)*plVar4;
  }
  local_148 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  var_to_str<int>(&local_d0,&this->b);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,0x159116);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_2a0 = *puVar7;
    lStack_298 = plVar4[3];
    local_2b0 = &local_2a0;
  }
  else {
    local_2a0 = *puVar7;
    local_2b0 = (ulong *)*plVar4;
  }
  local_2a8 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  uVar8 = 0xf;
  if (local_150 != &local_140) {
    uVar8 = local_140;
  }
  if (uVar8 < (ulong)(local_2a8 + local_148)) {
    uVar8 = 0xf;
    if (local_2b0 != &local_2a0) {
      uVar8 = local_2a0;
    }
    if (uVar8 < (ulong)(local_2a8 + local_148)) goto LAB_00120621;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_2b0,0,(char *)0x0,(ulong)local_150);
  }
  else {
LAB_00120621:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_2b0);
  }
  local_170 = &local_160;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_160 = *plVar4;
    uStack_158 = puVar5[3];
  }
  else {
    local_160 = *plVar4;
    local_170 = (long *)*puVar5;
  }
  local_168 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_170);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_120 = *puVar7;
    lStack_118 = plVar4[3];
    local_130 = &local_120;
  }
  else {
    local_120 = *puVar7;
    local_130 = (ulong *)*plVar4;
  }
  local_128 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  bVar2 = this->v;
  local_f0[0] = local_e0;
  std::__cxx11::string::_M_construct((ulong)local_f0,'\x01');
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_f0[0],1,(uint)bVar2);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)local_f0,0,(char *)0x0,0x15934d);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_1e0 = *puVar7;
    lStack_1d8 = plVar4[3];
    local_1f0 = &local_1e0;
  }
  else {
    local_1e0 = *puVar7;
    local_1f0 = (ulong *)*plVar4;
  }
  local_1e8 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  uVar8 = 0xf;
  if (local_130 != &local_120) {
    uVar8 = local_120;
  }
  if (uVar8 < (ulong)(local_1e8 + local_128)) {
    uVar8 = 0xf;
    if (local_1f0 != &local_1e0) {
      uVar8 = local_1e0;
    }
    if ((ulong)(local_1e8 + local_128) <= uVar8) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_1f0,0,(char *)0x0,(ulong)local_130);
      goto LAB_00120825;
    }
  }
  puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_1f0);
LAB_00120825:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar5 + 2;
  if ((size_type *)*puVar5 == psVar1) {
    uVar3 = puVar5[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar5;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar5[1];
  *puVar5 = psVar1;
  puVar5[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_1f0 != &local_1e0) {
    operator_delete(local_1f0,local_1e0 + 1);
  }
  if (local_f0[0] != local_e0) {
    operator_delete(local_f0[0],local_e0[0] + 1);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130,local_120 + 1);
  }
  if (local_170 != &local_160) {
    operator_delete(local_170,local_160 + 1);
  }
  if (local_2b0 != &local_2a0) {
    operator_delete(local_2b0,local_2a0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150,local_140 + 1);
  }
  if (local_190 != &local_180) {
    operator_delete(local_190,local_180 + 1);
  }
  if (local_290 != &local_280) {
    operator_delete(local_290,local_280 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if (local_210 != &local_200) {
    operator_delete(local_210,local_200 + 1);
  }
  if (local_1b0 != &local_1a0) {
    operator_delete(local_1b0,local_1a0 + 1);
  }
  if (local_270 != &local_260) {
    operator_delete(local_270,local_260 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (local_230 != &local_220) {
    operator_delete(local_230,local_220 + 1);
  }
  if (local_1d0 != &local_1c0) {
    operator_delete(local_1d0,local_1c0 + 1);
  }
  if (local_2d0 != &local_2c0) {
    operator_delete(local_2d0,local_2c0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_250 != &local_240) {
    operator_delete(local_250,local_240 + 1);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110,local_100 + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string vars() override {
        return VARS_TO_STR6(type, n, m, r, b, v);
    }